

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O0

void Dar_Truth4VarNPN(unsigned_short **puCanons,char **puPhases,char **puPerms,uchar **puMap)

{
  uchar uVar1;
  byte bVar2;
  uint uVar4;
  uint uVar5;
  unsigned_short *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  uchar *__ptr_02;
  char **__ptr_03;
  int iVar6;
  int local_70;
  int local_6c;
  int k;
  int i;
  int nClasses;
  int nFuncs;
  char *uPerms;
  char *uPhases;
  char **pPerms4;
  uint uPerm;
  uint uPhase;
  uint uTruth;
  uchar *uMap;
  unsigned_short *uCanons;
  uchar **puMap_local;
  char **puPerms_local;
  char **puPhases_local;
  unsigned_short **puCanons_local;
  unsigned_short uVar3;
  
  __ptr = (unsigned_short *)calloc(0x10000,2);
  __ptr_00 = (char *)calloc(0x10000,1);
  __ptr_01 = (char *)calloc(0x10000,1);
  __ptr_02 = (uchar *)calloc(0x10000,1);
  __ptr_03 = Dar_Permutations(4);
  k = 1;
  uPerm = 1;
  do {
    if (0x7fff < uPerm) {
      uPerm = 1;
      while( true ) {
        if (0xfffe < uPerm) {
          __ptr_00[0xffff] = '\x10';
          if (k != 0xde) {
            __assert_fail("nClasses == 222",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                          ,0x170,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          if (__ptr_03 != (char **)0x0) {
            free(__ptr_03);
          }
          if (puCanons == (unsigned_short **)0x0) {
            if (__ptr != (unsigned_short *)0x0) {
              free(__ptr);
            }
          }
          else {
            *puCanons = __ptr;
          }
          if (puPhases == (char **)0x0) {
            if (__ptr_00 != (char *)0x0) {
              free(__ptr_00);
            }
          }
          else {
            *puPhases = __ptr_00;
          }
          if (puPerms == (char **)0x0) {
            if (__ptr_01 != (char *)0x0) {
              free(__ptr_01);
            }
          }
          else {
            *puPerms = __ptr_01;
          }
          if (puMap == (uchar **)0x0) {
            if (__ptr_02 != (uchar *)0x0) {
              free(__ptr_02);
            }
          }
          else {
            *puMap = __ptr_02;
          }
          return;
        }
        if (__ptr_02[uPerm] == '\0') break;
        uPerm = uPerm + 1;
      }
      __assert_fail("uMap[uTruth] != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                    ,0x16e,
                    "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
    }
    if (__ptr[uPerm] == 0) {
      iVar6 = k + 1;
      __ptr_02[uPerm] = (uchar)k;
      for (local_6c = 0; k = iVar6, local_6c < 0x10; local_6c = local_6c + 1) {
        uVar4 = Dar_TruthPolarize(uPerm,local_6c,4);
        local_70 = 0;
        while( true ) {
          uVar3 = (unsigned_short)uPerm;
          bVar2 = (byte)local_6c;
          if (0x17 < local_70) break;
          uVar5 = Dar_TruthPermute(uVar4,__ptr_03[local_70],4,0);
          if (__ptr[uVar5] == 0) {
            __ptr[uVar5] = uVar3;
            __ptr_00[uVar5] = bVar2;
            __ptr_01[uVar5] = (char)local_70;
            __ptr_02[uVar5] = __ptr_02[uPerm];
            uVar5 = (uVar5 ^ 0xffffffff) & 0xffff;
            __ptr[uVar5] = uVar3;
            __ptr_00[uVar5] = bVar2 | 0x10;
            __ptr_01[uVar5] = (char)local_70;
            __ptr_02[uVar5] = __ptr_02[uPerm];
          }
          else if (__ptr[uVar5] != uPerm) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                          ,0x155,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          local_70 = local_70 + 1;
        }
        uVar4 = Dar_TruthPolarize((uPerm ^ 0xffffffff) & 0xffff,local_6c,4);
        for (local_70 = 0; local_70 < 0x18; local_70 = local_70 + 1) {
          uVar5 = Dar_TruthPermute(uVar4,__ptr_03[local_70],4,0);
          if (__ptr[uVar5] == 0) {
            __ptr[uVar5] = uVar3;
            __ptr_00[uVar5] = bVar2;
            __ptr_01[uVar5] = (char)local_70;
            __ptr_02[uVar5] = __ptr_02[uPerm];
            uVar5 = (uVar5 ^ 0xffffffff) & 0xffff;
            __ptr[uVar5] = uVar3;
            __ptr_00[uVar5] = bVar2 | 0x10;
            __ptr_01[uVar5] = (char)local_70;
            __ptr_02[uVar5] = __ptr_02[uPerm];
          }
          else if (__ptr[uVar5] != uPerm) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                          ,0x169,
                          "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
        }
      }
    }
    else {
      if (uPerm <= __ptr[uPerm]) {
        __assert_fail("uTruth > uCanons[uTruth]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                      ,0x13c,
                      "void Dar_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                     );
      }
      uVar1 = __ptr_02[__ptr[uPerm]];
      __ptr_02[uPerm] = uVar1;
      __ptr_02[(uPerm ^ 0xffffffff) & 0xffff] = uVar1;
    }
    uPerm = uPerm + 1;
  } while( true );
}

Assistant:

void Dar_Truth4VarNPN( unsigned short ** puCanons, char ** puPhases, char ** puPerms, unsigned char ** puMap )
{
    unsigned short * uCanons;
    unsigned char * uMap;
    unsigned uTruth, uPhase, uPerm;
    char ** pPerms4, * uPhases, * uPerms;
    int nFuncs, nClasses;
    int i, k;

    nFuncs  = (1 << 16);
    uCanons = ABC_CALLOC( unsigned short, nFuncs );
    uPhases = ABC_CALLOC( char, nFuncs );
    uPerms  = ABC_CALLOC( char, nFuncs );
    uMap    = ABC_CALLOC( unsigned char, nFuncs );
    pPerms4 = Dar_Permutations( 4 );

    nClasses = 1;
    nFuncs = (1 << 15);
    for ( uTruth = 1; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            uMap[~uTruth & 0xFFFF] = uMap[uTruth] = uMap[uCanons[uTruth]];
            continue;
        }
        uMap[uTruth] = nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Dar_TruthPolarize( uTruth, i, 4 );
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Dar_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
            uPhase = Dar_TruthPolarize( ~uTruth & 0xFFFF, i, 4 ); 
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Dar_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                    uMap[uPerm]    = uMap[uTruth];
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
        }
    }
    for ( uTruth = 1; uTruth < 0xffff; uTruth++ )
        assert( uMap[uTruth] != 0 );
    uPhases[(1<<16)-1] = 16;
    assert( nClasses == 222 );
    ABC_FREE( pPerms4 );
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( puPerms ) 
        *puPerms = uPerms;
    else
        ABC_FREE( uPerms );
    if ( puMap ) 
        *puMap = uMap;
    else
        ABC_FREE( uMap );
}